

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deBlockBuffer.hpp
# Opt level: O2

ssize_t __thiscall
de::BlockBuffer<unsigned_char>::write
          (BlockBuffer<unsigned_char> *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  undefined4 extraout_EAX;
  undefined4 extraout_var;
  undefined8 *puVar2;
  int iVar3;
  
  if (this->m_canceled == 0) {
    Mutex::lock(&this->m_writeLock);
    for (iVar3 = 0; __fd - iVar3 != 0 && iVar3 <= __fd; iVar3 = iVar3 + iVar1) {
      iVar1 = writeToCurrentBlock(this,__fd - iVar3,(uchar *)((long)iVar3 + (long)__buf),true);
    }
    Mutex::unlock(&this->m_writeLock);
    return CONCAT44(extraout_var,extraout_EAX);
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = &PTR__exception_00282bc8;
  __cxa_throw(puVar2,&BufferCanceledException::typeinfo,std::exception::~exception);
}

Assistant:

void BlockBuffer<T>::write (int numElements, const T* elements)
{
	DE_ASSERT(numElements > 0 && elements != DE_NULL);

	if (m_canceled)
		throw CanceledException();

	m_writeLock.lock();

	int numWritten = 0;
	while (numWritten < numElements)
		numWritten += writeToCurrentBlock(numElements-numWritten, elements+numWritten, true /* blocking */);

	m_writeLock.unlock();
}